

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O3

testing_base testing_new(int argc,char **argv,int flags)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  FILE *__stream;
  uint uVar4;
  int iVar5;
  testing_base ptVar6;
  char *pcVar7;
  char *pcVar8;
  byte *pbVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  
  ptVar6 = (testing_base)calloc(1,0x78);
  ptVar6->flags = flags;
  __stream = _stderr;
  ptVar6->fp = (FILE *)_stderr;
  ptVar6->argc = argc;
  ptVar6->argv = argv;
  ptVar6->parallelism = 1;
  ptVar6->run_tests = 1;
  ptVar6->is_uniprocessor = -1;
  pcVar2 = *argv;
  lVar14 = 0;
  pcVar10 = pcVar2;
  do {
    pcVar7 = strrchr(pcVar10,(int)"/\\"[lVar14]);
    pcVar8 = pcVar7 + 1;
    if (pcVar7 == (char *)0x0) {
      pcVar8 = pcVar10;
    }
    lVar14 = lVar14 + 1;
    pcVar10 = pcVar8;
  } while (lVar14 != 2);
  ptVar6->prog = pcVar8;
  if (argc == 1) {
    uVar4 = 0;
    uVar11 = 1;
  }
  else {
    uVar11 = 1;
    iVar13 = 0;
    do {
      pbVar3 = (byte *)argv[(int)uVar11];
      uVar12 = uVar11;
      if (*pbVar3 != 0x2d) break;
      pbVar9 = pbVar3;
      if ((pbVar3[1] == 0x2d) && (pbVar3[2] == 0)) {
        uVar4 = 0;
        if (pbVar3[1] == 0x2d) {
          uVar4 = (uint)(pbVar3[2] == 0);
        }
        goto LAB_00104da9;
      }
LAB_00104cc8:
      pbVar9 = pbVar9 + 1;
      bVar1 = *pbVar9;
      if (0x61 < bVar1) {
        switch(bVar1) {
        case 0x68:
          ptVar6->suppress_header = 1;
          goto LAB_00104cc8;
        case 0x69:
        case 0x6a:
        case 0x6b:
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x75:
        case 0x77:
          goto switchD_00104ce0_caseD_69;
        case 0x6c:
          iVar13 = iVar13 + 1;
          goto LAB_00104d4d;
        case 0x6d:
          uVar11 = uVar11 + 1;
          if (uVar11 != argc) {
            ptVar6->include_pat = argv[(int)uVar11];
            goto LAB_00104cc8;
          }
          pcVar10 = "%s: -m flag expects ,- or |-separated strings\n";
          break;
        case 0x6e:
          uVar11 = uVar11 + 1;
          if ((uVar11 != argc) && (iVar5 = atoi(argv[(int)uVar11]), 0 < iVar5)) {
            ptVar6->parallelism = iVar5;
            goto LAB_00104cc8;
          }
          pcVar10 = "%s: -n flag expects parallelism value >= 1\n";
          break;
        case 0x73:
          iVar13 = iVar13 + -1;
LAB_00104d4d:
          ptVar6->longshort = iVar13;
          goto LAB_00104cc8;
        case 0x76:
          ptVar6->verbose = 1;
          goto LAB_00104cc8;
        case 0x78:
          uVar11 = uVar11 + 1;
          if (uVar11 != argc) {
            ptVar6->exclude_pat = argv[(int)uVar11];
            goto LAB_00104cc8;
          }
          pcVar10 = "%s: -x flag expects ,- or |-separated strings\n";
          break;
        default:
          if (bVar1 != 0x62) goto switchD_00104ce0_caseD_69;
          ptVar6->run_benchmarks = 1;
          goto LAB_00104cc8;
        }
        fprintf(__stream,pcVar10,pcVar2);
        goto LAB_00104e49;
      }
      if (bVar1 == 0x42) goto code_r0x00104cf7;
      if (bVar1 != 0) {
        if (bVar1 == 0x48) {
          output_header(_stdout,"");
          exit(0);
        }
switchD_00104ce0_caseD_69:
        fprintf(__stream,"%s: unrecognized flag \'%c\' in arg %d: \"%s\"\n",pcVar2,
                (ulong)(uint)(int)(char)bVar1,(ulong)uVar11,pbVar3);
LAB_00104e49:
        exit(2);
      }
      uVar11 = uVar11 + 1;
      uVar12 = argc;
    } while (uVar11 != argc);
    uVar4 = 0;
    uVar11 = uVar12;
  }
LAB_00104da9:
  ptVar6->argn = uVar11 + uVar4;
  return ptVar6;
code_r0x00104cf7:
  ptVar6->run_tests = 0;
  ptVar6->run_benchmarks = 1;
  goto LAB_00104cc8;
}

Assistant:

testing_base testing_new (int argc, char *argv[], int flags) {
	static const char sep[] = { '/', '\\' };
	int i;
	int argn;
	testing_base tb = (testing_base)malloc (sizeof (*tb));
	memset ((void *) tb, 0, sizeof (*tb));
	tb->flags = flags;
	tb->fp = stderr;
	tb->argc = argc;
	tb->argv = argv;
	tb->parallelism = 1;
	tb->run_tests = 1;
	tb->is_uniprocessor = -1;
	tb->prog = tb->argv[0];
	for (i = 0; i != sizeof (sep) / sizeof (sep[0]); i++) {
		char *last = strrchr (tb->prog, sep[i]);
		if (last != NULL) {
			tb->prog = last + 1;
		}
	}
	for (argn = 1; argn != argc && argv[argn][0] == '-' &&
		       strcmp (argv[argn], "--") != 0; argn++) {
		const char *arg = argv[argn];
		const char *f;
		for (f = &arg[1]; *f != 0; f++) {
			process_flag (tb, &argn, argc, argv, *f, arg);
		}
	}
	tb->argn = argn + (argn != argc && strcmp (argv[argn], "--") == 0);
	return (tb);
}